

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O3

MPP_RET mpp_enc_control_set_ref_cfg(MppEncImpl *enc,void *param)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  MppEncRefCfg dst_00;
  MppEncRefCfg dst;
  MppEncRefCfg local_28;
  
  dst_00 = (enc->cfg).ref_cfg;
  local_28 = dst_00;
  if (param == (void *)0x0) {
    param = mpp_enc_ref_default();
  }
  if (dst_00 == (MppEncRefCfg)0x0) {
    mpp_enc_ref_cfg_init(&local_28);
    (enc->cfg).ref_cfg = local_28;
    dst_00 = local_28;
  }
  MVar1 = mpp_enc_ref_cfg_copy(dst_00,param);
  if (MVar1 != MPP_OK) {
    _mpp_log_l(2,"mpp_enc","failed to copy ref cfg ret %d\n","mpp_enc_control_set_ref_cfg",
               (ulong)(uint)MVar1);
  }
  MVar1 = mpp_enc_refs_set_cfg(enc->refs,local_28);
  if (MVar1 != MPP_OK) {
    _mpp_log_l(2,"mpp_enc","failed to set ref cfg ret %d\n","mpp_enc_control_set_ref_cfg",
               (ulong)(uint)MVar1);
  }
  RVar2 = mpp_enc_refs_update_hdr(enc->refs);
  if (RVar2 != 0) {
    (enc->hdr_status).val = 0;
  }
  return MVar1;
}

Assistant:

static MPP_RET mpp_enc_control_set_ref_cfg(MppEncImpl *enc, void *param)
{
    MPP_RET ret = MPP_OK;
    MppEncRefCfg src = (MppEncRefCfg)param;
    MppEncRefCfg dst = enc->cfg.ref_cfg;

    if (NULL == src)
        src = mpp_enc_ref_default();

    if (NULL == dst) {
        mpp_enc_ref_cfg_init(&dst);
        enc->cfg.ref_cfg = dst;
    }

    ret = mpp_enc_ref_cfg_copy(dst, src);
    if (ret) {
        mpp_err_f("failed to copy ref cfg ret %d\n", ret);
    }

    ret = mpp_enc_refs_set_cfg(enc->refs, dst);
    if (ret) {
        mpp_err_f("failed to set ref cfg ret %d\n", ret);
    }

    if (mpp_enc_refs_update_hdr(enc->refs))
        enc->hdr_status.val = 0;

    return ret;
}